

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

ImVec2 ImGui::NavCalcPreferredRefPos(void)

{
  ImVec2 *mouse_pos;
  ImGuiWindow *pIVar1;
  ImGuiContext *pIVar2;
  bool bVar3;
  ImGuiContext *g;
  ImVec2 IVar4;
  ImVec2 IVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  float fVar8;
  float fVar9;
  ImVec2 pos;
  ImRect visible_rect;
  ImVec2 local_28;
  ImVec2 local_20;
  ImVec2 IStack_18;
  
  pIVar2 = GImGui;
  if (((GImGui->NavDisableHighlight == false) && (GImGui->NavDisableMouseHover == true)) &&
     (pIVar1 = GImGui->NavWindow, pIVar1 != (ImGuiWindow *)0x0)) {
    auVar6._0_4_ = (GImGui->Style).FramePadding.x * 4.0;
    IVar5 = pIVar1->NavRectRel[GImGui->NavLayer].Min;
    fVar8 = IVar5.x;
    IVar4 = pIVar1->NavRectRel[GImGui->NavLayer].Max;
    fVar9 = IVar4.y;
    auVar6._4_4_ = (GImGui->Style).FramePadding.y;
    auVar6._8_8_ = 0;
    auVar7._4_4_ = fVar9 - IVar5.y;
    auVar7._0_4_ = IVar4.x - fVar8;
    auVar7._8_8_ = 0;
    auVar7 = minps(auVar6,auVar7);
    local_28.x = (pIVar1->Pos).x + fVar8 + auVar7._0_4_;
    local_28.y = (pIVar1->Pos).y + (fVar9 - auVar7._4_4_);
    IStack_18 = (GImGui->IO).DisplaySize;
    local_20.x = 0.0;
    local_20.y = 0.0;
    IVar4 = ImClamp(&local_28,&local_20,IStack_18);
    IVar5.x = (float)(int)IVar4.x;
    IVar5.y = (float)(int)IVar4.y;
  }
  else {
    mouse_pos = &(GImGui->IO).MousePos;
    bVar3 = IsMousePosValid(mouse_pos);
    if (bVar3) {
      IVar5 = *mouse_pos;
    }
    else {
      IVar5 = pIVar2->LastValidMousePos;
    }
  }
  return IVar5;
}

Assistant:

static ImVec2 ImGui::NavCalcPreferredRefPos()
{
    ImGuiContext& g = *GImGui;
    if (g.NavDisableHighlight || !g.NavDisableMouseHover || !g.NavWindow)
    {
        // Mouse (we need a fallback in case the mouse becomes invalid after being used)
        if (IsMousePosValid(&g.IO.MousePos))
            return g.IO.MousePos;
        return g.LastValidMousePos;
    }
    else
    {
        // When navigation is active and mouse is disabled, decide on an arbitrary position around the bottom left of the currently navigated item.
        const ImRect& rect_rel = g.NavWindow->NavRectRel[g.NavLayer];
        ImVec2 pos = g.NavWindow->Pos + ImVec2(rect_rel.Min.x + ImMin(g.Style.FramePadding.x * 4, rect_rel.GetWidth()), rect_rel.Max.y - ImMin(g.Style.FramePadding.y, rect_rel.GetHeight()));
        ImRect visible_rect = GetViewportRect();
        return ImFloor(ImClamp(pos, visible_rect.Min, visible_rect.Max));   // ImFloor() is important because non-integer mouse position application in back-end might be lossy and result in undesirable non-zero delta.
    }
}